

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizes_Test::testBody
          (TEST_TestMemoryAccountant_reportWithCacheSizes_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  MemoryAccountant local_28;
  size_t cacheSizes [1];
  TEST_TestMemoryAccountant_reportWithCacheSizes_Test *this_local;
  
  local_28.useCacheSizes_ = true;
  local_28._17_7_ = 0;
  cacheSizes[0] = (size_t)this;
  MemoryAccountant::useCacheSizes
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,
             (size_t *)&local_28.useCacheSizes_,1);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,8);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,0xc);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,0x14);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  pUVar1 = UtestShell::getCurrent();
  MemoryAccountant::report(&local_28);
  pcVar2 = SimpleString::asCharString((SimpleString *)&local_28);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "CppUTest Memory Accountant report (with cache sizes):\nCache size          # allocations    # deallocations   max # allocations at one time\n    4                   2                1                 1\nother                   0                3                 0\n   Thank you for your business\n"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x205,pTVar3);
  SimpleString::~SimpleString((SimpleString *)&local_28);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {4};

    accountant.useCacheSizes(cacheSizes, 1);
    accountant.dealloc(8);
    accountant.dealloc(12);
    accountant.dealloc(20);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "other                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}